

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

void __thiscall cppnet::BufferQueue::Append(BufferQueue *this)

{
  bool bVar1;
  element_type *args;
  shared_ptr<cppnet::BufferBlock> local_30;
  undefined1 local_20 [8];
  shared_ptr<cppnet::BufferBlock> temp;
  BufferQueue *this_local;
  
  temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  args = std::__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&this->_alloter);
  AlloterWrap::PoolNewSharePtr<cppnet::BufferBlock,std::shared_ptr<cppnet::BlockMemoryPool>&>
            ((AlloterWrap *)local_20,(shared_ptr<cppnet::BlockMemoryPool> *)args);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_buffer_write);
  if (!bVar1) {
    std::shared_ptr<cppnet::BufferBlock>::operator=
              (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)local_20);
  }
  std::shared_ptr<cppnet::BufferBlock>::shared_ptr
            (&local_30,(shared_ptr<cppnet::BufferBlock> *)local_20);
  List<cppnet::BufferBlock>::PushBack(&this->_buffer_list,&local_30);
  std::shared_ptr<cppnet::BufferBlock>::~shared_ptr(&local_30);
  std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_20);
  return;
}

Assistant:

void BufferQueue::Append() {
    auto temp = _alloter->PoolNewSharePtr<BufferBlock>(_block_alloter);

    if (!_buffer_write) {
        _buffer_write = temp;
    }
    
    _buffer_list.PushBack(temp);
}